

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O0

Map_HashTable_t * Map_SuperTableCreate(Map_SuperLib_t *pLib)

{
  int iVar1;
  Map_HashTable_t *__s;
  Map_HashEntry_t **ppMVar2;
  Map_HashTable_t *p;
  Map_SuperLib_t *pLib_local;
  
  __s = (Map_HashTable_t *)malloc(0x18);
  memset(__s,0,0x18);
  __s->mmMan = pLib->mmEntries;
  iVar1 = Abc_PrimeCudd(20000);
  __s->nBins = iVar1;
  ppMVar2 = (Map_HashEntry_t **)malloc((long)__s->nBins << 3);
  __s->pBins = ppMVar2;
  memset(__s->pBins,0,(long)__s->nBins << 3);
  return __s;
}

Assistant:

Map_HashTable_t * Map_SuperTableCreate( Map_SuperLib_t * pLib )
{
    Map_HashTable_t * p;
    // allocate the table
    p = ABC_ALLOC( Map_HashTable_t, 1 );
    memset( p, 0, sizeof(Map_HashTable_t) );
    p->mmMan = pLib->mmEntries;
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(20000);
    p->pBins = ABC_ALLOC( Map_HashEntry_t *, p->nBins );
    memset( p->pBins, 0, sizeof(Map_HashEntry_t *) * p->nBins );
    return p;
}